

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O2

void __thiscall
Js::SourceDynamicProfileManager::AddSavingItem
          (SourceDynamicProfileManager *this,LocalFunctionId functionId,DynamicProfileInfo *info)

{
  DynamicProfileInfo *local_28;
  DynamicProfileInfo *info_local;
  LocalFunctionId functionId_local;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  local_28 = info;
  info_local._0_4_ = functionId;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&info_local + 4),ExceptionType_OutOfMemory);
  JsUtil::
  BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->dynamicProfileInfoMapSaving,(uint *)&info_local,&local_28);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&info_local + 4));
  return;
}

Assistant:

void SourceDynamicProfileManager::AddSavingItem(LocalFunctionId functionId, DynamicProfileInfo *info)
    {
        try
        {
            // our BaseDictionary does not allow nothrow allocator
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
            dynamicProfileInfoMapSaving.Item(functionId, info);
        }
        catch (Js::OutOfMemoryException&)
        {
            Output::Print(_u("Hit OOM while saving dynamic profile info\n"));
        }
    }